

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_decode.c
# Opt level: O0

void base64_decode_bs(BinarySink *bs,ptrlen input)

{
  BinarySink *bs_00;
  int iVar1;
  uchar local_59;
  ulong uStack_58;
  char c;
  size_t i;
  undefined1 local_48;
  uchar binatom [3];
  char b64atom [4];
  BinarySource src [1];
  BinarySink *bs_local;
  ptrlen input_local;
  
  BinarySource_INIT__((BinarySource *)&local_48,input);
  while (*(long *)(src[0]._24_8_ + 0x10) != *(long *)(src[0]._24_8_ + 8)) {
    uStack_58 = 0;
    while (uStack_58 < 4) {
      local_59 = BinarySource_get_byte((BinarySource *)src[0]._24_8_);
      if (*(int *)(src[0]._24_8_ + 0x18) != 0) {
        local_59 = '=';
      }
      if ((local_59 != '\n') && (local_59 != '\r')) {
        *(uchar *)((long)&i + uStack_58 + 4) = local_59;
        uStack_58 = uStack_58 + 1;
      }
    }
    bs_00 = bs->binarysink_;
    iVar1 = base64_decode_atom((char *)((long)&i + 4),(uchar *)((long)&i + 1));
    BinarySink_put_data(bs_00,(void *)((long)&i + 1),(long)iVar1);
  }
  return;
}

Assistant:

void base64_decode_bs(BinarySink *bs, ptrlen input)
{
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, input);

    while (get_avail(src)) {
        char b64atom[4];
        unsigned char binatom[3];

        for (size_t i = 0; i < 4 ;) {
            char c = get_byte(src);
            if (get_err(src))
                c = '=';
            if (c == '\n' || c == '\r')
                continue;
            b64atom[i++] = c;
        }

        put_data(bs, binatom, base64_decode_atom(b64atom, binatom));
    }
}